

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::PopulateFormalsScope
          (ByteCodeGenerator *this,uint beginOffset,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  anon_class_40_5_07c1c418 handler;
  anon_class_40_5_07c1c418 handler_00;
  ParseNodeFnc *pPVar1;
  FuncInfo *pFVar2;
  FuncInfo *pFVar3;
  ParseNodeVar *pPVar4;
  ParseNode *pPVar5;
  ParseNodeParamPattern *pPVar6;
  FunctionBody *pFVar7;
  DiagExtraScopesType DVar8;
  ParseNodeFnc *local_50;
  ParseNodeFnc *pnodeFnc_local;
  FuncInfo *pFStack_40;
  uint beginOffset_local;
  FuncInfo *funcInfo_local;
  DebuggerScope *debuggerScope;
  
  funcInfo_local = (FuncInfo *)0x0;
  pnodeFnc_local._4_4_ = beginOffset;
  pFStack_40 = funcInfo;
  local_50 = pnodeFnc;
  for (pPVar5 = pnodeFnc->pnodeParams; pPVar5 != (ParseNode *)0x0;
      pPVar5 = ParseNode::GetFormalNext(pPVar5)) {
    if ((byte)(pPVar5->nop + ~knopList) < 3) {
      if (funcInfo_local == (FuncInfo *)0x0) {
        if (pFStack_40->paramScope == (Scope *)0x0) {
          DVar8 = DiagParamScope;
        }
        else {
          DVar8 = DiagParamScopeInObject - ((pFStack_40->paramScope->field_0x44 & 2) == 0);
        }
        funcInfo_local =
             (FuncInfo *)
             RecordStartScopeObject(this,&local_50->super_ParseNode,DVar8,0xffffffff,(int *)0x0);
        Js::DebuggerScope::SetBegin((DebuggerScope *)funcInfo_local,pnodeFnc_local._4_4_);
      }
      pFVar3 = funcInfo_local;
      pFVar2 = pFStack_40;
      pPVar4 = ParseNode::AsParseNodeVar(pPVar5);
      InsertPropertyToDebuggerScope(this,pFVar2,(DebuggerScope *)pFVar3,pPVar4->sym);
    }
  }
  pPVar5 = pnodeFnc->pnodeRest;
  if ((pPVar5 != (ParseNode *)0x0) && ((byte)(pPVar5->nop + ~knopList) < 3)) {
    if (funcInfo_local == (FuncInfo *)0x0) {
      if (pFStack_40->paramScope == (Scope *)0x0) {
        DVar8 = DiagParamScope;
      }
      else {
        DVar8 = DiagParamScopeInObject - ((pFStack_40->paramScope->field_0x44 & 2) == 0);
      }
      funcInfo_local =
           (FuncInfo *)
           RecordStartScopeObject(this,&local_50->super_ParseNode,DVar8,0xffffffff,(int *)0x0);
      Js::DebuggerScope::SetBegin((DebuggerScope *)funcInfo_local,pnodeFnc_local._4_4_);
    }
    pFVar3 = funcInfo_local;
    pFVar2 = pFStack_40;
    pPVar4 = ParseNode::AsParseNodeVar(pPVar5);
    InsertPropertyToDebuggerScope(this,pFVar2,(DebuggerScope *)pFVar3,pPVar4->sym);
  }
  pPVar1 = local_50;
  for (pPVar5 = local_50->pnodeParams; pPVar5 != (ParseNode *)0x0;
      pPVar5 = ParseNode::GetFormalNext(pPVar5)) {
    if (pPVar5->nop == knopParamPattern) {
      pPVar6 = ParseNode::AsParseNodeParamPattern(pPVar5);
      handler.this = this;
      handler.debuggerScope = (DebuggerScope **)&funcInfo_local;
      handler.pnodeFnc = &local_50;
      handler.funcInfo = &stack0xffffffffffffffc0;
      handler.beginOffset = (uint *)((long)&pnodeFnc_local + 4);
      Parser::
      MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
                ((pPVar6->super_ParseNodeUni).pnode1,handler);
    }
  }
  pPVar5 = pPVar1->pnodeRest;
  if ((pPVar5 != (ParseNode *)0x0) && (pPVar5->nop == knopParamPattern)) {
    pPVar6 = ParseNode::AsParseNodeParamPattern(pPVar5);
    handler_00.this = this;
    handler_00.debuggerScope = (DebuggerScope **)&funcInfo_local;
    handler_00.pnodeFnc = &local_50;
    handler_00.funcInfo = &stack0xffffffffffffffc0;
    handler_00.beginOffset = (uint *)((long)&pnodeFnc_local + 4);
    Parser::
    MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
              ((pPVar6->super_ParseNodeUni).pnode1,handler_00);
  }
  if (funcInfo_local != (FuncInfo *)0x0) {
    pFVar7 = FuncInfo::GetParsedFunctionBody(pFStack_40);
    if ((pFVar7->field_0x17b & 4) == 0) {
      InsertPropertyToDebuggerScope
                (this,pFStack_40,(DebuggerScope *)funcInfo_local,pFStack_40->argumentsSymbol);
    }
    RecordEndScopeObject(this,&local_50->super_ParseNode);
  }
  return;
}

Assistant:

void ByteCodeGenerator::PopulateFormalsScope(uint beginOffset, FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc)
{
    Js::DebuggerScope *debuggerScope = nullptr;
    auto processArg = [&](ParseNode *pnodeArg) {
        if (pnodeArg->IsVarLetOrConst())
        {
            if (debuggerScope == nullptr)
            {
                debuggerScope = RecordStartScopeObject(pnodeFnc, funcInfo->paramScope && funcInfo->paramScope->GetIsObject() ? Js::DiagParamScopeInObject : Js::DiagParamScope);
                debuggerScope->SetBegin(beginOffset);
            }

            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, pnodeArg->AsParseNodeVar()->sym);
        }
    };

    MapFormals(pnodeFnc, processArg);
    MapFormalsFromPattern(pnodeFnc, processArg);

    if (debuggerScope != nullptr)
    {
        if (!funcInfo->GetParsedFunctionBody()->IsParamAndBodyScopeMerged())
        {
            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, funcInfo->GetArgumentsSymbol());
        }

        RecordEndScopeObject(pnodeFnc);
    }
}